

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O2

int macro_install(void)

{
  t_macro *ptVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  
  lablptr->type = 5;
  uVar3 = 0;
  for (lVar2 = 1; lVar2 <= symbol[0]; lVar2 = lVar2 + 1) {
    iVar4 = uVar3 + (int)symbol[lVar2];
    uVar3 = (iVar4 >> 5) + (int)symbol[lVar2] + iVar4 * 8;
  }
  ptVar1 = (t_macro *)malloc(0x50);
  mptr = ptVar1;
  if (ptVar1 == (t_macro *)0x0) {
    error("Out of memory!");
  }
  else {
    strcpy(ptVar1->name,symbol + 1);
    ptVar1->line = (t_line *)0x0;
    ptVar1->next = macro_tbl[uVar3 & 0xff];
    macro_tbl[uVar3 & 0xff] = ptVar1;
    mlptr = (t_line *)0x0;
  }
  return (uint)(ptVar1 != (t_macro *)0x0);
}

Assistant:

int
macro_install(void)
{
	char c;
	int hash = 0;
	int i;

	/* mark the macro name as reserved */
	lablptr->type = MACRO;

	/* check macro name syntax */
	/*
	if (strchr(&symbol[1], '.')) {
		error("Invalid macro name!");
		return (0);
	}
	*/

	/* calculate symbol hash value */
	for (i = 1; i <= symbol[0]; i++) {
		c = symbol[i];
		hash += c;
		hash  = (hash << 3) + (hash >> 5) + c;
	}
	hash &= 0xFF;

	/* allocate a macro struct */
	mptr = (void *)malloc(sizeof(struct t_macro));
	if (mptr == NULL) {
		error("Out of memory!");
		return (0);
	}

	/* initialize it */
	strcpy(mptr->name, &symbol[1]);
	mptr->line = NULL;
	mptr->next = macro_tbl[hash];
	macro_tbl[hash] = mptr;
	mlptr = NULL;

	/* ok */
	return (1);
}